

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

void lha_replace_path_separator(lha *lha,archive_entry *entry)

{
  archive_wstring *paVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  size_t sVar4;
  size_t sVar5;
  
  pwVar3 = archive_entry_pathname_w(entry);
  if (pwVar3 != (wchar_t *)0x0) {
    paVar1 = &lha->ws;
    (lha->ws).length = 0;
    sVar4 = wcslen(pwVar3);
    archive_wstrncat(paVar1,pwVar3,sVar4);
    sVar2 = (lha->ws).length;
    if (sVar2 != 0) {
      pwVar3 = paVar1->s;
      sVar5 = 0;
      do {
        if (pwVar3[sVar5] == L'\\') {
          pwVar3[sVar5] = L'/';
        }
        sVar5 = sVar5 + 1;
      } while (sVar2 != sVar5);
    }
    archive_entry_copy_pathname_w(entry,paVar1->s);
  }
  pwVar3 = archive_entry_symlink_w(entry);
  if (pwVar3 != (wchar_t *)0x0) {
    paVar1 = &lha->ws;
    (lha->ws).length = 0;
    sVar4 = wcslen(pwVar3);
    archive_wstrncat(paVar1,pwVar3,sVar4);
    sVar2 = (lha->ws).length;
    if (sVar2 != 0) {
      pwVar3 = paVar1->s;
      sVar5 = 0;
      do {
        if (pwVar3[sVar5] == L'\\') {
          pwVar3[sVar5] = L'/';
        }
        sVar5 = sVar5 + 1;
      } while (sVar2 != sVar5);
    }
    archive_entry_copy_symlink_w(entry,paVar1->s);
    return;
  }
  return;
}

Assistant:

static void
lha_replace_path_separator(struct lha *lha, struct archive_entry *entry)
{
	const wchar_t *wp;
	size_t i;

	if ((wp = archive_entry_pathname_w(entry)) != NULL) {
		archive_wstrcpy(&(lha->ws), wp);
		for (i = 0; i < archive_strlen(&(lha->ws)); i++) {
			if (lha->ws.s[i] == L'\\')
				lha->ws.s[i] = L'/';
		}
		archive_entry_copy_pathname_w(entry, lha->ws.s);
	}

	if ((wp = archive_entry_symlink_w(entry)) != NULL) {
		archive_wstrcpy(&(lha->ws), wp);
		for (i = 0; i < archive_strlen(&(lha->ws)); i++) {
			if (lha->ws.s[i] == L'\\')
				lha->ws.s[i] = L'/';
		}
		archive_entry_copy_symlink_w(entry, lha->ws.s);
	}
}